

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O1

pair<duckdb::TableFunction,_bool> * __thiscall
duckdb::FunctionSerializer::DeserializeBase<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
          (pair<duckdb::TableFunction,_bool> *__return_storage_ptr__,FunctionSerializer *this,
          Deserializer *deserializer,CatalogType catalog_type)

{
  undefined1 uVar1;
  ClientContext *this_00;
  bool has_serialize;
  vector<duckdb::LogicalType,_true> original_arguments;
  vector<duckdb::LogicalType,_true> arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  TableFunction function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd78;
  bool local_279;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_278;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_258;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_218;
  string local_1f8;
  TableFunction local_1d8;
  
  this_00 = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)this);
  (**(code **)(*(long *)this + 0x10))(this,500,"name");
  (**(code **)(*(long *)this + 0xd0))(local_238,this);
  (**(code **)(*(long *)this + 0x18))(this);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_258,(Deserializer *)this,0x1f5,"arguments")
  ;
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_278,(Deserializer *)this,0x1f6,
             "original_arguments");
  local_1f8._M_dataplus._M_p =
       (pointer)local_258.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_string_length =
       (size_type)
       local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1f8.field_2._M_allocated_capacity =
       (size_type)
       local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_278.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_218.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_278.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_218.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_278.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_278.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeserializeFunction<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
            (&local_1d8,(FunctionSerializer *)this_00,(ClientContext *)((ulong)deserializer & 0xff),
             (CatalogType)local_238,&local_1f8,(vector<duckdb::LogicalType,_true> *)&local_218,
             in_stack_fffffffffffffd78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_218);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1f8);
  (**(code **)(*(long *)this + 0x10))(this,0x1f7,"has_serialize");
  uVar1 = (**(code **)(*(long *)this + 0x60))(this);
  (**(code **)(*(long *)this + 0x18))(this);
  local_279 = (bool)uVar1;
  ::std::pair<duckdb::TableFunction,_bool>::pair<duckdb::TableFunction,_bool_&,_true>
            (__return_storage_ptr__,&local_1d8,&local_279);
  local_1d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02477bc0;
  if (local_1d8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d8.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_278);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_258);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static pair<FUNC, bool> DeserializeBase(Deserializer &deserializer, CatalogType catalog_type) {
		auto &context = deserializer.Get<ClientContext &>();
		auto name = deserializer.ReadProperty<string>(500, "name");
		auto arguments = deserializer.ReadProperty<vector<LogicalType>>(501, "arguments");
		auto original_arguments = deserializer.ReadProperty<vector<LogicalType>>(502, "original_arguments");
		auto function = DeserializeFunction<FUNC, CATALOG_ENTRY>(context, catalog_type, name, std::move(arguments),
		                                                         std::move(original_arguments));
		auto has_serialize = deserializer.ReadProperty<bool>(503, "has_serialize");
		return make_pair(std::move(function), has_serialize);
	}